

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

void fs_write_alotof_bufs_with_offset(int add_flags)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uv_buf_t *bufs;
  char *__ptr;
  uv_loop_t *puVar4;
  uv_buf_t *unaff_RBX;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  uv_buf_t uVar8;
  char acStack_52 [2];
  uv_buf_t *puStack_50;
  
  puStack_50 = (uv_buf_t *)0x1563bd;
  unlink("test_file");
  puStack_50 = (uv_buf_t *)0x1563c2;
  loop = uv_default_loop();
  puStack_50 = (uv_buf_t *)0x1563d3;
  bufs = (uv_buf_t *)malloc(0xd4310);
  if (bufs == (uv_buf_t *)0x0) {
LAB_0015671f:
    bufs = unaff_RBX;
    puStack_50 = (uv_buf_t *)0x156724;
    fs_write_alotof_bufs_with_offset_cold_17();
LAB_00156724:
    puStack_50 = (uv_buf_t *)0x156729;
    fs_write_alotof_bufs_with_offset_cold_1();
LAB_00156729:
    puStack_50 = (uv_buf_t *)0x15672e;
    fs_write_alotof_bufs_with_offset_cold_2();
LAB_0015672e:
    puStack_50 = (uv_buf_t *)0x156733;
    fs_write_alotof_bufs_with_offset_cold_3();
LAB_00156733:
    puStack_50 = (uv_buf_t *)0x156738;
    fs_write_alotof_bufs_with_offset_cold_4();
LAB_00156738:
    puStack_50 = (uv_buf_t *)0x15673d;
    fs_write_alotof_bufs_with_offset_cold_5();
LAB_0015673d:
    puStack_50 = (uv_buf_t *)0x156742;
    fs_write_alotof_bufs_with_offset_cold_6();
LAB_00156742:
    puStack_50 = (uv_buf_t *)0x156747;
    fs_write_alotof_bufs_with_offset_cold_16();
LAB_00156747:
    puStack_50 = (uv_buf_t *)0x15674c;
    fs_write_alotof_bufs_with_offset_cold_7();
LAB_0015674c:
    puStack_50 = (uv_buf_t *)0x156751;
    fs_write_alotof_bufs_with_offset_cold_8();
LAB_00156751:
    puStack_50 = (uv_buf_t *)0x156756;
    fs_write_alotof_bufs_with_offset_cold_10();
LAB_00156756:
    puStack_50 = (uv_buf_t *)0x15675b;
    fs_write_alotof_bufs_with_offset_cold_11();
LAB_0015675b:
    puStack_50 = (uv_buf_t *)0x156760;
    fs_write_alotof_bufs_with_offset_cold_12();
LAB_00156760:
    puStack_50 = (uv_buf_t *)0x156765;
    fs_write_alotof_bufs_with_offset_cold_13();
LAB_00156765:
    puStack_50 = (uv_buf_t *)0x15676a;
    fs_write_alotof_bufs_with_offset_cold_14();
  }
  else {
    puStack_50 = (uv_buf_t *)0x156402;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x42,0x180,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00156724;
    if (open_req1.result._4_4_ < 0) goto LAB_00156729;
    puStack_50 = (uv_buf_t *)0x156424;
    uv_fs_req_cleanup(&open_req1);
    puStack_50 = (uv_buf_t *)0x156435;
    iov = uv_buf_init("0123456789",10);
    puStack_50 = (uv_buf_t *)0x156473;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar2 != 10) goto LAB_0015672e;
    if (write_req.result != 10) goto LAB_00156733;
    puStack_50 = (uv_buf_t *)0x156498;
    uv_fs_req_cleanup(&write_req);
    lVar7 = 8;
    do {
      puStack_50 = (uv_buf_t *)0x1564b2;
      uVar8 = uv_buf_init(test_buf,0xd);
      *(char **)((long)bufs + lVar7 + -8) = uVar8.base;
      *(size_t *)((long)&bufs->base + lVar7) = uVar8.len;
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0xd4318);
    puStack_50 = (uv_buf_t *)0x1564f3;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,bufs,0xd431,10,
                        (uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00156738;
    if (write_req.result != 0xac67d) goto LAB_0015673d;
    puStack_50 = (uv_buf_t *)0x156518;
    uv_fs_req_cleanup(&write_req);
    puStack_50 = (uv_buf_t *)0x156522;
    __ptr = (char *)malloc(0xac67d);
    if (__ptr == (char *)0x0) goto LAB_00156742;
    lVar7 = 8;
    pcVar5 = __ptr;
    do {
      puStack_50 = (uv_buf_t *)0x156544;
      uVar8 = uv_buf_init(pcVar5,0xd);
      *(char **)((long)bufs + lVar7 + -8) = uVar8.base;
      *(size_t *)((long)&bufs->base + lVar7) = uVar8.len;
      lVar7 = lVar7 + 0x10;
      pcVar5 = pcVar5 + 0xd;
    } while (lVar7 != 0xd4318);
    puStack_50 = (uv_buf_t *)0x156586;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,bufs,0xd431,10,
                       (uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00156747;
    lVar7 = 0xd;
    if (iVar2 != 0xd) {
      lVar7 = 0x3400;
    }
    if (read_req.result != lVar7) goto LAB_0015674c;
    pcVar5 = __ptr;
    uVar6 = 0;
    do {
      puStack_50 = (uv_buf_t *)0x1565d0;
      iVar3 = strncmp(pcVar5,test_buf,0xd);
      if (iVar3 != 0) {
        puStack_50 = (uv_buf_t *)0x15671f;
        fs_write_alotof_bufs_with_offset_cold_9();
        unaff_RBX = bufs;
        goto LAB_0015671f;
      }
      if (iVar2 == 0xd) break;
      pcVar5 = pcVar5 + 0xd;
      bVar1 = uVar6 < 0x3ff;
      uVar6 = uVar6 + 1;
    } while (bVar1);
    puStack_50 = (uv_buf_t *)0x1565fd;
    uv_fs_req_cleanup(&read_req);
    puStack_50 = (uv_buf_t *)0x156605;
    free(__ptr);
    puStack_50 = (uv_buf_t *)0x15661c;
    iVar2 = uv_fs_stat((uv_loop_t *)0x0,&stat_req,"test_file",(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00156751;
    if (*(long *)((long)stat_req.ptr + 0x38) != write_req.result + 10) goto LAB_00156756;
    puStack_50 = (uv_buf_t *)0x156650;
    uv_fs_req_cleanup(&stat_req);
    puStack_50 = (uv_buf_t *)0x156661;
    uVar8 = uv_buf_init(buf,0x20);
    puStack_50 = (uv_buf_t *)0x1566a2;
    iov = uVar8;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,
                       write_req.result + 10,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0015675b;
    if (read_req.result != 0) goto LAB_00156760;
    puStack_50 = (uv_buf_t *)0x1566c4;
    uv_fs_req_cleanup(&read_req);
    puStack_50 = (uv_buf_t *)0x1566da;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00156765;
    if (close_req.result == 0) {
      puStack_50 = (uv_buf_t *)0x1566f8;
      uv_fs_req_cleanup(&close_req);
      puStack_50 = (uv_buf_t *)0x156704;
      unlink("test_file");
      free(bufs);
      return;
    }
  }
  puStack_50 = (uv_buf_t *)run_test_fs_read_dir;
  fs_write_alotof_bufs_with_offset_cold_15();
  puStack_50 = bufs;
  loop = uv_default_loop();
  rmdir("test_dir");
  iVar2 = uv_fs_mkdir(loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar2 == 0) {
    uv_run(loop,UV_RUN_DEFAULT);
    if (mkdir_cb_count != 1) goto LAB_001568e1;
    iVar2 = uv_fs_open(loop,&open_req1,"test_dir",0x10000,0x180,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_001568e6;
    uv_fs_req_cleanup(&open_req1);
    uVar8 = uv_buf_init(acStack_52,2);
    iov = uVar8;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x15) goto LAB_001568eb;
    uv_fs_req_cleanup(&read_req);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 == 0) {
      uv_fs_req_cleanup(&close_req);
      rmdir("test_dir");
      puVar4 = uv_default_loop();
      uv_walk(puVar4,close_walk_cb,(void *)0x0);
      uv_run(puVar4,UV_RUN_DEFAULT);
      puVar4 = uv_default_loop();
      iVar2 = uv_loop_close(puVar4);
      if (iVar2 == 0) {
        return;
      }
      goto LAB_001568f5;
    }
  }
  else {
    run_test_fs_read_dir_cold_1();
LAB_001568e1:
    run_test_fs_read_dir_cold_2();
LAB_001568e6:
    run_test_fs_read_dir_cold_3();
LAB_001568eb:
    run_test_fs_read_dir_cold_4();
  }
  run_test_fs_read_dir_cold_5();
LAB_001568f5:
  run_test_fs_read_dir_cold_6();
  test_fs_partial(1);
  return;
}

Assistant:

static void fs_write_alotof_bufs_with_offset(int add_flags) {
  size_t iovcount;
  size_t iovmax;
  uv_buf_t* iovs;
  char* buffer;
  size_t index;
  int r;
  int64_t offset;
  char* filler;
  int filler_len;

  filler = "0123456789";
  filler_len = strlen(filler);
  iovcount = 54321;

  /* Setup. */
  unlink("test_file");

  loop = uv_default_loop();

  iovs = malloc(sizeof(*iovs) * iovcount);
  ASSERT(iovs != NULL);
  iovmax = uv_test_getiovmax();

  r = uv_fs_open(NULL,
                 &open_req1,
                 "test_file",
                 O_RDWR | O_CREAT | add_flags,
                 S_IWUSR | S_IRUSR,
                 NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  iov = uv_buf_init(filler, filler_len);
  r = uv_fs_write(NULL, &write_req, open_req1.result, &iov, 1, -1, NULL);
  ASSERT(r == filler_len);
  ASSERT(write_req.result == filler_len);
  uv_fs_req_cleanup(&write_req);
  offset = (int64_t)r;

  for (index = 0; index < iovcount; ++index)
    iovs[index] = uv_buf_init(test_buf, sizeof(test_buf));

  r = uv_fs_write(NULL,
                  &write_req,
                  open_req1.result,
                  iovs,
                  iovcount,
                  offset,
                  NULL);
  ASSERT(r >= 0);
  ASSERT((size_t)write_req.result == sizeof(test_buf) * iovcount);
  uv_fs_req_cleanup(&write_req);

  /* Read the strings back to separate buffers. */
  buffer = malloc(sizeof(test_buf) * iovcount);
  ASSERT(buffer != NULL);

  for (index = 0; index < iovcount; ++index)
    iovs[index] = uv_buf_init(buffer + index * sizeof(test_buf),
                              sizeof(test_buf));

  r = uv_fs_read(NULL, &read_req, open_req1.result,
                 iovs, iovcount, offset, NULL);
  ASSERT(r >= 0);
  if (r == sizeof(test_buf))
    iovcount = 1; /* Infer that preadv is not available. */
  else if (iovcount > iovmax)
    iovcount = iovmax;
  ASSERT((size_t)read_req.result == sizeof(test_buf) * iovcount);

  for (index = 0; index < iovcount; ++index)
    ASSERT(strncmp(buffer + index * sizeof(test_buf),
                   test_buf,
                   sizeof(test_buf)) == 0);

  uv_fs_req_cleanup(&read_req);
  free(buffer);

  r = uv_fs_stat(NULL, &stat_req, "test_file", NULL);
  ASSERT(r == 0);
  ASSERT((int64_t)((uv_stat_t*)stat_req.ptr)->st_size ==
         offset + (int64_t)write_req.result);
  uv_fs_req_cleanup(&stat_req);

  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL,
                 &read_req,
                 open_req1.result,
                 &iov,
                 1,
                 offset + write_req.result,
                 NULL);
  ASSERT(r == 0);
  ASSERT(read_req.result == 0);
  uv_fs_req_cleanup(&read_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  /* Cleanup */
  unlink("test_file");
  free(iovs);
}